

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode curl_multi_add_handle(Curl_multi *multi,Curl_easy *data)

{
  Curl_easy *pCVar1;
  conncache *pcVar2;
  long lVar3;
  CURLMcode rc;
  Curl_easy *data_local;
  Curl_multi *multi_local;
  
  if ((multi == (Curl_multi *)0x0) || (multi->magic != 0xbab1e)) {
    multi_local._4_4_ = CURLM_BAD_HANDLE;
  }
  else if ((data == (Curl_easy *)0x0) || (data->magic != 0xc0dedbad)) {
    multi_local._4_4_ = CURLM_BAD_EASY_HANDLE;
  }
  else if (data->multi == (Curl_multi *)0x0) {
    if (((byte)multi->field_0x1b1 >> 2 & 1) == 0) {
      if (((byte)multi->field_0x1b1 >> 4 & 1) != 0) {
        if (multi->num_alive != 0) {
          return CURLM_ABORTED_BY_CALLBACK;
        }
        multi->field_0x1b1 = multi->field_0x1b1 & 0xef;
      }
      Curl_llist_init(&(data->state).timeoutlist,(Curl_llist_dtor)0x0);
      if ((data->set).errorbuffer != (char *)0x0) {
        *(data->set).errorbuffer = '\0';
      }
      data->multi = multi;
      Curl_expire(data,0,EXPIRE_RUN_NOW);
      memset(&multi->timer_lastcall,0,0x10);
      multi_local._4_4_ = Curl_update_timer(multi);
      if (multi_local._4_4_ == CURLM_OK) {
        mstate(data,MSTATE_INIT);
        if (((data->dns).hostcache == (Curl_hash *)0x0) ||
           ((data->dns).hostcachetype == HCACHE_NONE)) {
          (data->dns).hostcache = &multi->hostcache;
          (data->dns).hostcachetype = HCACHE_MULTI;
        }
        if ((data->share == (Curl_share *)0x0) || ((data->share->specifier & 0x20) == 0)) {
          (data->state).conn_cache = &multi->conn_cache;
        }
        else {
          (data->state).conn_cache = &data->share->conn_cache;
        }
        (data->state).lastconnect_id = -1;
        link_easy(multi,data);
        multi->num_easy = multi->num_easy + 1;
        multi->num_alive = multi->num_alive + 1;
        if (data->share != (Curl_share *)0x0) {
          Curl_share_lock(data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
        }
        (((data->state).conn_cache)->closure_handle->set).timeout = (data->set).timeout;
        (((data->state).conn_cache)->closure_handle->set).server_response_timeout =
             (data->set).server_response_timeout;
        pCVar1 = ((data->state).conn_cache)->closure_handle;
        *(ulong *)&(pCVar1->set).field_0x8ba =
             *(ulong *)&(pCVar1->set).field_0x8ba & 0xfffffffeffffffff |
             (ulong)((uint)((ulong)*(undefined8 *)&(data->set).field_0x8ba >> 0x20) & 1) << 0x20;
        pcVar2 = (data->state).conn_cache;
        lVar3 = pcVar2->next_easy_id;
        pcVar2->next_easy_id = lVar3 + 1;
        data->id = lVar3;
        if (((data->state).conn_cache)->next_easy_id < 1) {
          ((data->state).conn_cache)->next_easy_id = 0;
        }
        if (data->share != (Curl_share *)0x0) {
          Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
        }
        multi_local._4_4_ = CURLM_OK;
      }
    }
    else {
      multi_local._4_4_ = CURLM_RECURSIVE_API_CALL;
    }
  }
  else {
    multi_local._4_4_ = CURLM_ADDED_ALREADY;
  }
  return multi_local._4_4_;
}

Assistant:

CURLMcode curl_multi_add_handle(struct Curl_multi *multi,
                                struct Curl_easy *data)
{
  CURLMcode rc;
  /* First, make some basic checks that the CURLM handle is a good handle */
  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  /* Verify that we got a somewhat good easy handle too */
  if(!GOOD_EASY_HANDLE(data))
    return CURLM_BAD_EASY_HANDLE;

  /* Prevent users from adding same easy handle more than once and prevent
     adding to more than one multi stack */
  if(data->multi)
    return CURLM_ADDED_ALREADY;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  if(multi->dead) {
    /* a "dead" handle cannot get added transfers while any existing easy
       handles are still alive - but if there are none alive anymore, it is
       fine to start over and unmark the "deadness" of this handle */
    if(multi->num_alive)
      return CURLM_ABORTED_BY_CALLBACK;
    multi->dead = FALSE;
  }

  /* Initialize timeout list for this handle */
  Curl_llist_init(&data->state.timeoutlist, NULL);

  /*
   * No failure allowed in this function beyond this point. And no
   * modification of easy nor multi handle allowed before this except for
   * potential multi's connection cache growing which won't be undone in this
   * function no matter what.
   */
  if(data->set.errorbuffer)
    data->set.errorbuffer[0] = 0;

  /* make the Curl_easy refer back to this multi handle - before Curl_expire()
     is called. */
  data->multi = multi;

  /* Set the timeout for this handle to expire really soon so that it will
     be taken care of even when this handle is added in the midst of operation
     when only the curl_multi_socket() API is used. During that flow, only
     sockets that time-out or have actions will be dealt with. Since this
     handle has no action yet, we make sure it times out to get things to
     happen. */
  Curl_expire(data, 0, EXPIRE_RUN_NOW);

  /* A somewhat crude work-around for a little glitch in Curl_update_timer()
     that happens if the lastcall time is set to the same time when the handle
     is removed as when the next handle is added, as then the check in
     Curl_update_timer() that prevents calling the application multiple times
     with the same timer info will not trigger and then the new handle's
     timeout will not be notified to the app.

     The work-around is thus simply to clear the 'lastcall' variable to force
     Curl_update_timer() to always trigger a callback to the app when a new
     easy handle is added */
  memset(&multi->timer_lastcall, 0, sizeof(multi->timer_lastcall));

  rc = Curl_update_timer(multi);
  if(rc)
    return rc;

  /* set the easy handle */
  multistate(data, MSTATE_INIT);

  /* for multi interface connections, we share DNS cache automatically if the
     easy handle's one is currently not set. */
  if(!data->dns.hostcache ||
     (data->dns.hostcachetype == HCACHE_NONE)) {
    data->dns.hostcache = &multi->hostcache;
    data->dns.hostcachetype = HCACHE_MULTI;
  }

  /* Point to the shared or multi handle connection cache */
  if(data->share && (data->share->specifier & (1<< CURL_LOCK_DATA_CONNECT)))
    data->state.conn_cache = &data->share->conn_cache;
  else
    data->state.conn_cache = &multi->conn_cache;
  data->state.lastconnect_id = -1;

#ifdef USE_LIBPSL
  /* Do the same for PSL. */
  if(data->share && (data->share->specifier & (1 << CURL_LOCK_DATA_PSL)))
    data->psl = &data->share->psl;
  else
    data->psl = &multi->psl;
#endif

  link_easy(multi, data);

  /* increase the node-counter */
  multi->num_easy++;

  /* increase the alive-counter */
  multi->num_alive++;

  CONNCACHE_LOCK(data);
  /* The closure handle only ever has default timeouts set. To improve the
     state somewhat we clone the timeouts from each added handle so that the
     closure handle always has the same timeouts as the most recently added
     easy handle. */
  data->state.conn_cache->closure_handle->set.timeout = data->set.timeout;
  data->state.conn_cache->closure_handle->set.server_response_timeout =
    data->set.server_response_timeout;
  data->state.conn_cache->closure_handle->set.no_signal =
    data->set.no_signal;
  data->id = data->state.conn_cache->next_easy_id++;
  if(data->state.conn_cache->next_easy_id <= 0)
    data->state.conn_cache->next_easy_id = 0;
  CONNCACHE_UNLOCK(data);

  multi_warn_debug(multi, data);

  return CURLM_OK;
}